

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGParameters.h
# Opt level: O0

void __thiscall
dg::DGParameters<dg::LLVMNode>::DGParameters(DGParameters<dg::LLVMNode> *this,LLVMNode *cs)

{
  void *pvVar1;
  DependenceGraphT *dg;
  BBlock<dg::LLVMNode> *in_RSI;
  LLVMNode *in_RDI;
  DependenceGraphT *in_stack_ffffffffffffffe0;
  
  std::
  map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
  ::map((map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
         *)0x178a8d);
  std::
  map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
  ::map((map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
         *)0x178a9b);
  std::
  unique_ptr<dg::DGParameterPair<dg::LLVMNode>,std::default_delete<dg::DGParameterPair<dg::LLVMNode>>>
  ::unique_ptr<std::default_delete<dg::DGParameterPair<dg::LLVMNode>>,void>
            ((unique_ptr<dg::DGParameterPair<dg::LLVMNode>,_std::default_delete<dg::DGParameterPair<dg::LLVMNode>_>_>
              *)in_stack_ffffffffffffffe0);
  std::unique_ptr<dg::LLVMNode,std::default_delete<dg::LLVMNode>>::
  unique_ptr<std::default_delete<dg::LLVMNode>,void>
            ((unique_ptr<dg::LLVMNode,_std::default_delete<dg::LLVMNode>_> *)
             in_stack_ffffffffffffffe0);
  pvVar1 = operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(in_RSI,in_RDI,in_stack_ffffffffffffffe0);
  *(void **)&(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).useEdges.
             super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl = pvVar1;
  dg = (DependenceGraphT *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(in_RSI,in_RDI,dg);
  *(DependenceGraphT **)
   &(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).useEdges.
    super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.super__Rb_tree_header._M_header =
       dg;
  *(BBlock<dg::LLVMNode> **)
   ((long)&(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).useEdges.
           super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.super__Rb_tree_header + 8) =
       in_RSI;
  return;
}

Assistant:

DGParameters<NodeT>(NodeT *cs = nullptr)
            : BBIn(new BBlock<NodeT>), BBOut(new BBlock<NodeT>), callSite(cs) {}